

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O0

void __thiscall
ManifestFile::GetInstanceExtensionProperties
          (ManifestFile *this,
          vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *props)

{
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *props_local;
  ManifestFile *this_local;
  
  GetExtensionProperties(&this->_instance_extensions,props);
  return;
}

Assistant:

void ManifestFile::GetInstanceExtensionProperties(std::vector<XrExtensionProperties> &props) {
    GetExtensionProperties(_instance_extensions, props);
}